

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Gia_Man_t * Gia_ManFalseRebuildPath(Gia_Man_t *p,Vec_Int_t *vHooks,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  int iVar2;
  int iLit1;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar5;
  ulong uVar6;
  int v;
  
  if ((long)vHooks->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  iVar1 = vHooks->pArray[(long)vHooks->nSize + -1];
  p_00 = Gia_ManStart((p->nObjs << 2) / 3);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (v = 1; v < p->nObjs; v = v + 1) {
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar3 = (uint)*(ulong *)pObj;
    uVar6 = *(ulong *)pObj & 0x1fffffff;
    iVar2 = (int)uVar6;
    if (uVar6 == 0x1fffffff || (int)uVar3 < 0) {
      if ((~uVar3 & 0x9fffffff) == 0) {
        uVar3 = Gia_ManAppendCi(p_00);
      }
      else {
        if (-1 < (int)uVar3 || iVar2 == 0x1fffffff) goto LAB_0056efa1;
        iVar2 = Gia_ObjFanin0Copy(pObj);
        uVar3 = Gia_ManAppendCo(p_00,iVar2);
      }
LAB_0056ef9d:
      pObj->Value = uVar3;
    }
    else {
      if (iVar1 != v) {
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iLit1 = Gia_ObjFanin1Copy(pObj);
        uVar3 = Gia_ManHashAnd(p_00,iVar2,iLit1);
        goto LAB_0056ef9d;
      }
      Gia_ManFalseRebuildOne(p_00,p,vHooks,iVar2,fVeryVerbose);
    }
LAB_0056efa1:
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManFalseRebuildPath( Gia_Man_t * p, Vec_Int_t * vHooks, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iPathEnd = Vec_IntEntryLast(vHooks);
    pNew = Gia_ManStart( 4 * Gia_ManObjNum(p) / 3 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( iPathEnd == i )
                Gia_ManFalseRebuildOne( pNew, p, vHooks, fVerbose, fVeryVerbose );
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}